

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O0

void test_write_error(void)

{
  cio_inet_address *arg1;
  char *request;
  cio_http_location target;
  undefined1 local_210 [4];
  cio_error err;
  cio_http_server server;
  cio_http_server_configuration config;
  
  header_complete_fake.custom_fake = callback_write_ok_response;
  cio_buffered_stream_write_fake.custom_fake = bs_write_error_in_callback;
  memcpy(server.keepalive_header + 0x20,&DAT_00123728,0xb8);
  arg1 = cio_get_inet_address_any4();
  cio_init_inet_socket_address((cio_socket_address *)(server.keepalive_header + 0x20),arg1,0x1f90);
  target.config._4_4_ =
       cio_http_server_init
                 ((cio_http_server *)local_210,&loop,
                  (cio_http_server_configuration *)(server.keepalive_header + 0x20));
  UnityAssertEqualNumber
            (0,(long)target.config._4_4_,"Server initialization failed!",0x395,
             UNITY_DISPLAY_STYLE_INT);
  target.config._4_4_ =
       cio_http_location_init((cio_http_location *)&request,"/foo",(void *)0x0,alloc_dummy_handler);
  UnityAssertEqualNumber
            (0,(long)target.config._4_4_,"Request target initialization failed!",0x399,
             UNITY_DISPLAY_STYLE_INT);
  target.config._4_4_ =
       cio_http_server_register_location((cio_http_server *)local_210,(cio_http_location *)&request)
  ;
  UnityAssertEqualNumber
            (0,(long)target.config._4_4_,"Register request target failed!",0x39c,
             UNITY_DISPLAY_STYLE_INT);
  split_request("GET /foo HTTP/1.1\r\n\r\n");
  target.config._4_4_ = cio_http_server_serve((cio_http_server *)local_210);
  UnityAssertEqualNumber
            (0,(long)target.config._4_4_,"Serving http failed!",0x3a3,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)serve_error_fake.call_count,"Serve error callback was called!",0x3a4,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(ulong)message_complete_fake.call_count,"message_complete was not called!",0x3a6,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)header_complete_fake.call_count,"header_complete was not called!",0x3a7,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_write_error(void)
{
	header_complete_fake.custom_fake = callback_write_ok_response;
	cio_buffered_stream_write_fake.custom_fake = bs_write_error_in_callback;

	struct cio_http_server_configuration config = {
	    .on_error = serve_error,
	    .read_header_timeout_ns = header_read_timeout,
	    .read_body_timeout_ns = body_read_timeout,
	    .response_timeout_ns = response_timeout,
	    .close_timeout_ns = close_timeout_ns,
	    .alloc_client = alloc_dummy_client,
	    .free_client = free_dummy_client};

	cio_init_inet_socket_address(&config.endpoint, cio_get_inet_address_any4(), 8080);

	struct cio_http_server server;
	enum cio_error err = cio_http_server_init(&server, &loop, &config);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Server initialization failed!");

	struct cio_http_location target;
	err = cio_http_location_init(&target, "/foo", NULL, alloc_dummy_handler);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Request target initialization failed!");

	err = cio_http_server_register_location(&server, &target);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Register request target failed!");

	const char *request = "GET /foo HTTP/1.1" CRLF CRLF;

	split_request(request);

	err = cio_http_server_serve(&server);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Serving http failed!");
	TEST_ASSERT_EQUAL_MESSAGE(1, serve_error_fake.call_count, "Serve error callback was called!");
	// Because the response is written in on_headers_complete, on_message_complete will not be called
	TEST_ASSERT_EQUAL_MESSAGE(0, message_complete_fake.call_count, "message_complete was not called!");
	TEST_ASSERT_EQUAL_MESSAGE(1, header_complete_fake.call_count, "header_complete was not called!");
}